

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optimize.cc
# Opt level: O0

shared_ptr<kratos::StmtBlock> __thiscall
kratos::RemoveEmptyBlockVisitor::process
          (RemoveEmptyBlockVisitor *this,shared_ptr<kratos::StmtBlock> *stmt)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool bVar1;
  element_type *peVar2;
  reference psVar3;
  __shared_ptr_access<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false> *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<kratos::StmtBlock> sVar4;
  shared_ptr<kratos::Stmt> *st_1;
  iterator __end2;
  iterator __begin2;
  vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_> *__range2;
  shared_ptr<kratos::Stmt> local_78;
  undefined1 local_68 [8];
  shared_ptr<kratos::Stmt> r;
  shared_ptr<kratos::Stmt> st;
  uint64_t i;
  vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
  stmts_to_remove;
  uint64_t stmt_count;
  shared_ptr<kratos::StmtBlock> *stmt_local;
  RemoveEmptyBlockVisitor *this_local;
  
  peVar2 = std::__shared_ptr_access<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->(in_RDX);
  stmts_to_remove.
  super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)StmtBlock::size(peVar2);
  std::vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>::
  vector((vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_> *)
         &i);
  for (st.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      st.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi <
      stmts_to_remove.
      super__Vector_base<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage;
      st.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           ((long)&(st.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi)->_vptr__Sp_counted_base + 1)) {
    peVar2 = std::__shared_ptr_access<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(in_RDX);
    this_00 = &r.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    StmtBlock::get_stmt((StmtBlock *)this_00,(uint64_t)peVar2);
    std::shared_ptr<kratos::Stmt>::shared_ptr(&local_78,(shared_ptr<kratos::Stmt> *)this_00);
    dispatch_node((RemoveEmptyBlockVisitor *)local_68,(shared_ptr<kratos::Stmt> *)stmt);
    std::shared_ptr<kratos::Stmt>::~shared_ptr(&local_78);
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_68);
    if (bVar1) {
      peVar2 = std::__shared_ptr_access<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->(in_RDX);
      StmtBlock::set_child
                (peVar2,(uint64_t)
                        st.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                        _M_pi,(shared_ptr<kratos::Stmt> *)local_68);
    }
    else {
      std::vector<std::shared_ptr<kratos::Stmt>,std::allocator<std::shared_ptr<kratos::Stmt>>>::
      emplace_back<std::shared_ptr<kratos::Stmt>&>
                ((vector<std::shared_ptr<kratos::Stmt>,std::allocator<std::shared_ptr<kratos::Stmt>>>
                  *)&i,(shared_ptr<kratos::Stmt> *)
                       &r.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    }
    std::shared_ptr<kratos::Stmt>::~shared_ptr((shared_ptr<kratos::Stmt> *)local_68);
    std::shared_ptr<kratos::Stmt>::~shared_ptr
              ((shared_ptr<kratos::Stmt> *)
               &r.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  __end2 = std::
           vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>::
           begin((vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                  *)&i);
  st_1 = (shared_ptr<kratos::Stmt> *)
         std::vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
         ::end((vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                *)&i);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end2,(__normal_iterator<std::shared_ptr<kratos::Stmt>_*,_std::vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>_>
                                     *)&st_1), bVar1) {
    psVar3 = __gnu_cxx::
             __normal_iterator<std::shared_ptr<kratos::Stmt>_*,_std::vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>_>
             ::operator*(&__end2);
    peVar2 = std::__shared_ptr_access<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->(in_RDX);
    (*(peVar2->super_Stmt).super_IRNode._vptr_IRNode[10])(peVar2,psVar3);
    __gnu_cxx::
    __normal_iterator<std::shared_ptr<kratos::Stmt>_*,_std::vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>_>
    ::operator++(&__end2);
  }
  peVar2 = std::__shared_ptr_access<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->(in_RDX);
  bVar1 = StmtBlock::empty(peVar2);
  if (bVar1) {
    std::shared_ptr<kratos::StmtBlock>::shared_ptr
              ((shared_ptr<kratos::StmtBlock> *)this,(nullptr_t)0x0);
  }
  else {
    std::shared_ptr<kratos::StmtBlock>::shared_ptr
              ((shared_ptr<kratos::StmtBlock> *)this,(shared_ptr<kratos::StmtBlock> *)in_RDX);
  }
  std::vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>::
  ~vector((vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_> *)
          &i);
  sVar4.super___shared_ptr<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar4.super___shared_ptr<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<kratos::StmtBlock>)
         sVar4.super___shared_ptr<kratos::StmtBlock,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<StmtBlock> process(std::shared_ptr<StmtBlock> stmt) {
        auto stmt_count = stmt->size();
        std::vector<std::shared_ptr<Stmt>> stmts_to_remove;
        for (uint64_t i = 0; i < stmt_count; i++) {
            auto st = stmt->get_stmt(i);
            auto r = dispatch_node(st);
            if (!r) {
                stmts_to_remove.emplace_back(st);
                continue;
            }
            stmt->set_child(i, r);
        }
        for (auto const& st : stmts_to_remove) {
            stmt->remove_stmt(st);
        }
        if (stmt->empty())
            return nullptr;
        else
            return stmt;
    }